

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestCase::TestCase
          (TestCase *this,char *a_name,char *a_type_param,SetUpTestCaseFunc set_up_tc,
          TearDownTestCaseFunc tear_down_tc)

{
  undefined8 in_RCX;
  char *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  TestResult *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  bool local_4b;
  allocator local_4a;
  undefined1 local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  allocator local_29;
  undefined8 local_28;
  undefined8 local_20;
  char *local_18;
  
  *in_RDI = &PTR__TestCase_002781a8;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  local_49 = 0;
  local_4b = local_18 == (char *)0x0;
  if (local_4b) {
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    local_49 = 1;
    local_48 = local_98;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_98,local_18,&local_4a);
  }
  local_49 = 0;
  local_4b = !local_4b;
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::scoped_ptr((scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(in_RDI + 5),local_98);
  if (local_4b) {
    std::allocator<char>::~allocator((allocator<char> *)&local_4a);
  }
  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::vector
            ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)0x169a18);
  this_00 = (TestResult *)(in_RDI + 9);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x169a2b);
  in_RDI[0xc] = local_20;
  in_RDI[0xd] = local_28;
  *(undefined1 *)(in_RDI + 0xe) = 0;
  in_RDI[0xf] = 0;
  TestResult::TestResult(this_00);
  return;
}

Assistant:

TestCase::TestCase(const char* a_name, const char* a_type_param,
                   Test::SetUpTestCaseFunc set_up_tc,
                   Test::TearDownTestCaseFunc tear_down_tc)
    : name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : NULL),
      set_up_tc_(set_up_tc),
      tear_down_tc_(tear_down_tc),
      should_run_(false),
      elapsed_time_(0) {
}